

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbezier.cpp
# Opt level: O1

void __thiscall
QBezier::addToPolygon(QBezier *this,QPolygonF *polygon,qreal bezier_flattening_threshold)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int levels [10];
  QPointF local_2e8;
  undefined8 local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c8;
  undefined1 *puStack_2c0;
  undefined1 *local_2b8;
  qreal local_2a8;
  qreal aqStack_2a0 [3];
  qreal local_288 [4];
  double local_268 [4];
  undefined1 local_248 [16];
  undefined1 local_238 [536];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_268,0xff,0x240);
  local_2a8 = this->x1;
  aqStack_2a0[0] = this->y1;
  aqStack_2a0[1] = this->x2;
  aqStack_2a0[2] = this->y2;
  local_288[0] = this->x3;
  local_288[1] = this->y3;
  local_288[2] = this->x4;
  local_288[3] = this->y4;
  local_2d8 = (undefined1 *)CONCAT44(local_2d8._4_4_,9);
  uVar9 = 0;
  do {
    uVar12 = (ulong)uVar9;
    lVar10 = uVar12 * 0x40;
    dVar2 = *(double *)*(undefined1 (*) [16])(&local_2a8 + uVar12 * 8);
    dVar7 = aqStack_2a0[uVar12 * 8];
    dVar8 = local_288[uVar12 * 8 + 2];
    dVar16 = local_268[uVar12 * 8 + -1];
    dVar21 = dVar8 - dVar2;
    dVar22 = dVar16 - dVar7;
    dVar23 = -dVar22;
    uVar13 = -(ulong)(dVar21 < -dVar21);
    uVar14 = (ulong)dVar23 & -(ulong)(dVar22 < dVar23);
    auVar17._0_8_ = ~uVar13 & (ulong)dVar21;
    auVar17._8_8_ = ~-(ulong)(dVar22 < dVar23) & (ulong)dVar22;
    auVar3._8_4_ = (int)uVar14;
    auVar3._0_8_ = (ulong)-dVar21 & uVar13;
    auVar3._12_4_ = (int)(uVar14 >> 0x20);
    dVar22 = SUB168(auVar17 | auVar3,8) + SUB168(auVar17 | auVar3,0);
    if (dVar22 <= 1.0) {
      dVar22 = dVar2 - aqStack_2a0[uVar12 * 8 + 1];
      dVar21 = dVar7 - local_288[uVar12 * 8 + -1];
      uVar14 = -(ulong)(dVar22 < -dVar22);
      uVar15 = -(ulong)(dVar21 < -dVar21);
      dVar23 = dVar2 - local_288[uVar12 * 8];
      uVar13 = -(ulong)(dVar23 < -dVar23);
      dVar24 = (double)(~uVar13 & (ulong)dVar23 | (ulong)-dVar23 & uVar13) +
               (double)(~uVar15 & (ulong)dVar21 | (ulong)-dVar21 & uVar15) +
               (double)(~uVar14 & (ulong)dVar22 | (ulong)-dVar22 & uVar14);
      dVar21 = dVar7 - local_288[uVar12 * 8 + 1];
      dVar22 = 1.0;
    }
    else {
      dVar24 = (dVar7 - local_288[uVar12 * 8 + -1]) * dVar21 +
               (dVar2 - aqStack_2a0[uVar12 * 8 + 1]) * dVar23;
      uVar14 = -(ulong)(dVar24 < -dVar24);
      dVar24 = (double)(~uVar14 & (ulong)dVar24 | (ulong)-dVar24 & uVar14);
      dVar21 = (dVar7 - local_288[uVar12 * 8 + 1]) * dVar21 +
               (dVar2 - local_288[uVar12 * 8]) * dVar23;
    }
    uVar14 = -(ulong)(dVar21 < -dVar21);
    if (((double)(~uVar14 & (ulong)dVar21 | (ulong)-dVar21 & uVar14) + dVar24 <
         dVar22 * bezier_flattening_threshold) ||
       (iVar11 = *(int *)((long)&local_2d8 + uVar12 * 4), iVar11 == 0)) {
      local_2e8.xp = dVar8;
      local_2e8.yp = dVar16;
      QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF>
                ((QPodArrayOps<QPointF> *)polygon,(polygon->super_QList<QPointF>).d.size,&local_2e8)
      ;
      QList<QPointF>::end(&polygon->super_QList<QPointF>);
      uVar9 = uVar9 - 1;
    }
    else {
      local_268[uVar12 * 8] = dVar2;
      local_268[uVar12 * 8 + 1] = dVar7;
      dVar21 = (dVar2 + aqStack_2a0[uVar12 * 8 + 1]) * 0.5;
      dVar23 = (dVar7 + local_288[uVar12 * 8 + -1]) * 0.5;
      dVar24 = (aqStack_2a0[uVar12 * 8 + 1] + local_288[uVar12 * 8]) * 0.5;
      dVar18 = (local_288[uVar12 * 8 + -1] + local_288[uVar12 * 8 + 1]) * 0.5;
      dVar22 = (dVar8 + local_288[uVar12 * 8]) * 0.5;
      dVar2 = (dVar16 + local_288[uVar12 * 8 + 1]) * 0.5;
      dVar7 = (dVar21 + dVar24) * 0.5;
      dVar8 = (dVar23 + dVar18) * 0.5;
      dVar16 = (dVar24 + dVar22) * 0.5;
      dVar24 = (dVar18 + dVar2) * 0.5;
      local_268[uVar12 * 8 + 2] = dVar21;
      *(double *)(local_248 + lVar10 + -8) = dVar23;
      auVar4._8_4_ = SUB84(dVar8,0);
      auVar4._0_8_ = dVar7;
      auVar4._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *(undefined1 (*) [16])(local_248 + lVar10) = auVar4;
      dVar7 = (dVar7 + dVar16) * 0.5;
      dVar8 = (dVar8 + dVar24) * 0.5;
      uVar19 = SUB84(dVar8,0);
      uVar20 = (undefined4)((ulong)dVar8 >> 0x20);
      auVar5._8_4_ = uVar19;
      auVar5._0_8_ = dVar7;
      auVar5._12_4_ = uVar20;
      *(undefined1 (*) [16])(local_238 + lVar10) = auVar5;
      auVar6._8_4_ = uVar19;
      auVar6._0_8_ = dVar7;
      auVar6._12_4_ = uVar20;
      *(undefined1 (*) [16])(&local_2a8 + uVar12 * 8) = auVar6;
      aqStack_2a0[uVar12 * 8 + 1] = dVar16;
      local_288[uVar12 * 8 + -1] = dVar24;
      auVar1._8_4_ = SUB84(dVar2,0);
      auVar1._0_8_ = dVar22;
      auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
      *(undefined1 (*) [16])(local_288 + uVar12 * 8) = auVar1;
      iVar11 = iVar11 + -1;
      *(int *)((long)&local_2d8 + uVar12 * 4) = iVar11;
      *(int *)((long)&local_2d8 + uVar12 * 4 + 4) = iVar11;
      uVar9 = uVar9 + 1;
    }
  } while (-1 < (int)uVar9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBezier::addToPolygon(QPolygonF *polygon, qreal bezier_flattening_threshold) const
{
    QBezier beziers[10];
    int levels[10];
    beziers[0] = *this;
    levels[0] = 9;
    int top = 0;

    while (top >= 0) {
        QBezier *b = &beziers[top];
        // check if we can pop the top bezier curve from the stack
        qreal y4y1 = b->y4 - b->y1;
        qreal x4x1 = b->x4 - b->x1;
        qreal l = qAbs(x4x1) + qAbs(y4y1);
        qreal d;
        if (l > 1.) {
            d = qAbs( (x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2) )
                + qAbs( (x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3) );
        } else {
            d = qAbs(b->x1 - b->x2) + qAbs(b->y1 - b->y2) +
                qAbs(b->x1 - b->x3) + qAbs(b->y1 - b->y3);
            l = 1.;
        }
        if (d < bezier_flattening_threshold * l || levels[top] == 0) {
            // good enough, we pop it off and add the endpoint
            polygon->append(QPointF(b->x4, b->y4));
            --top;
        } else {
            // split, second half of the polygon goes lower into the stack
            std::tie(b[1], b[0]) = b->split();
            levels[top + 1] = --levels[top];
            ++top;
        }
    }
}